

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool PIT_FindFloorCeiling
               (FMultiBlockLinesIterator *mit,CheckResult *cres,FBoundingBox *box,
               FCheckPosition *tmf,int flags)

{
  line_t *ld;
  uint uVar1;
  AActor *in_RAX;
  AActor *extraout_RAX;
  double dVar2;
  FLineOpening open;
  DVector2 refpoint;
  FLineOpening local_d0;
  
  ld = cres->line;
  if ((((box->m_Box[2] <= ld->bbox[3] && ld->bbox[3] != box->m_Box[2]) &&
       (ld->bbox[2] <= box->m_Box[3] && box->m_Box[3] != ld->bbox[2])) &&
      (ld->bbox[1] <= box->m_Box[0] && box->m_Box[0] != ld->bbox[1])) &&
     (box->m_Box[1] <= ld->bbox[0] && ld->bbox[0] != box->m_Box[1])) {
    uVar1 = FBoundingBox::BoxOnLineSide(box,ld);
    in_RAX = (AActor *)(ulong)uVar1;
    if (uVar1 == 0xffffffff) {
      if (ffcf_verbose == true) {
        uVar1 = Printf("Hit line %d at position %f,%f, group %d\n",(cres->Position).X,
                       (cres->Position).Y,
                       (ulong)(uint)((int)((ulong)((long)ld - (long)lines) >> 3) * 0x286bca1b),
                       (ulong)(uint)ld->frontsector->PortalGroup);
        in_RAX = (AActor *)(ulong)uVar1;
      }
      if (ld->backsector != (sector_t *)0x0) {
        FindRefPoint((line_t *)&stack0xffffffffffffffc0,(DVector2 *)ld);
        P_LineOpening(&local_d0,tmf->thing,ld,(DVector2 *)&stack0xffffffffffffffc0,
                      (DVector2 *)&cres->Position,flags);
        in_RAX = extraout_RAX;
        if (((flags & 0x40U) == 0) && (local_d0.top < tmf->ceilingz)) {
          tmf->ceilingz = local_d0.top;
          if ((AActor *)local_d0.topsec != (AActor *)0x0) {
            tmf->ceilingsector = local_d0.topsec;
          }
          if (ffcf_verbose == true) {
            uVar1 = Printf("    Adjust ceilingz to %f\n");
            local_d0.topsec = (sector_t *)(ulong)uVar1;
          }
          mit->continueup = false;
          in_RAX = (AActor *)local_d0.topsec;
        }
        if ((flags & 0x20U) == 0) {
          dVar2 = tmf->floorz;
          if (local_d0.bottom <= dVar2) {
            if ((local_d0.bottom == dVar2) && (!NAN(local_d0.bottom) && !NAN(dVar2))) {
              tmf->touchmidtex = (bool)(tmf->touchmidtex | local_d0.touchmidtex);
              in_RAX = (AActor *)(ulong)local_d0.abovemidtex;
              tmf->abovemidtex = (bool)(tmf->abovemidtex | local_d0.abovemidtex);
            }
          }
          else {
            tmf->floorz = local_d0.bottom;
            if (local_d0.bottomsec != (sector_t *)0x0) {
              tmf->floorsector = local_d0.bottomsec;
            }
            tmf->touchmidtex = local_d0.touchmidtex;
            tmf->abovemidtex = local_d0.abovemidtex;
            dVar2 = local_d0.bottom;
            if (ffcf_verbose == true) {
              Printf("    Adjust floorz to %f\n");
              dVar2 = tmf->floorz;
            }
            in_RAX = tmf->thing;
            if (tmf->dropoffz + *(double *)(in_RAX->args + 0x50) < dVar2) {
              mit->continuedown = false;
            }
          }
          if ((-3.4028234663852886e+38 < local_d0.lowfloor) && (local_d0.lowfloor < tmf->dropoffz))
          {
            tmf->dropoffz = local_d0.lowfloor;
            if (ffcf_verbose == true) {
              Printf("    Adjust dropoffz to %f\n",local_d0.bottom);
              dVar2 = tmf->floorz;
              local_d0.lowfloor = tmf->dropoffz;
            }
            in_RAX = tmf->thing;
            if (local_d0.lowfloor + *(double *)(in_RAX->args + 0x50) < dVar2) {
              mit->continuedown = false;
            }
          }
        }
      }
    }
  }
  return SUB81(in_RAX,0);
}

Assistant:

static bool PIT_FindFloorCeiling(FMultiBlockLinesIterator &mit, FMultiBlockLinesIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tmf, int flags)
{
	line_t *ld = cres.line;

	if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
		return true;

	// A line has been hit

	if (ffcf_verbose)
	{
		Printf("Hit line %d at position %f,%f, group %d\n",
			int(ld - lines), cres.Position.X, cres.Position.Y, ld->frontsector->PortalGroup);
	}

	if (!ld->backsector)
	{ // One sided line
		return true;
	}

	DVector2 refpoint = FindRefPoint(ld, cres.Position);
	FLineOpening open;

	P_LineOpening(open, tmf.thing, ld, refpoint, &cres.Position, flags);

	// adjust floor / ceiling heights
	if (!(flags & FFCF_NOCEILING))
	{
		if (open.top < tmf.ceilingz)
		{
			tmf.ceilingz = open.top;
			if (open.topsec != NULL) tmf.ceilingsector = open.topsec;
			if (ffcf_verbose) Printf("    Adjust ceilingz to %f\n", open.top);
			mit.StopUp();
		}
	}

	if (!(flags & FFCF_NOFLOOR))
	{
		if (open.bottom > tmf.floorz)
		{
			tmf.floorz = open.bottom;
			if (open.bottomsec != NULL) tmf.floorsector = open.bottomsec;
			tmf.touchmidtex = open.touchmidtex;
			tmf.abovemidtex = open.abovemidtex;
			if (ffcf_verbose) Printf("    Adjust floorz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
		else if (open.bottom == tmf.floorz)
		{
			tmf.touchmidtex |= open.touchmidtex;
			tmf.abovemidtex |= open.abovemidtex;
		}

		if (open.lowfloor < tmf.dropoffz && open.lowfloor > LINEOPEN_MIN)
		{
			tmf.dropoffz = open.lowfloor;
			if (ffcf_verbose) Printf("    Adjust dropoffz to %f\n", open.bottom);
			if (tmf.floorz > tmf.dropoffz + tmf.thing->MaxDropOffHeight) mit.StopDown();
		}
	}
	return true;
}